

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QCss::Value>::clear(QList<QCss::Value> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QGenericArrayOps<QCss::Value> *this_00;
  __off_t __length;
  QArrayDataPointer<QCss::Value> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QCss::Value> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QCss::Value> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QCss::Value> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QCss::Value>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QCss::Value>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QCss::Value> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QCss::Value>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QCss::Value>::QArrayDataPointer(pQVar4,(qsizetype)alloc,(qsizetype)n,option)
      ;
      QArrayDataPointer<QCss::Value>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QCss::Value>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QGenericArrayOps<QCss::Value> *)QArrayDataPointer<QCss::Value>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QCss::Value>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }